

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregion.cpp
# Opt level: O0

void XorRegion(QRegionPrivate *sra,QRegionPrivate *srb,QRegionPrivate *dest)

{
  long lVar1;
  bool bVar2;
  QRegionPrivate *in_RDX;
  QRegionPrivate *in_RSI;
  QRegionPrivate *in_RDI;
  long in_FS_OFFSET;
  QRegionPrivate trb;
  QRegionPrivate tra;
  QRegionPrivate *in_stack_ffffffffffffff58;
  QRegionPrivate *in_stack_ffffffffffffff78;
  undefined1 local_48 [40];
  QRegionPrivate *in_stack_ffffffffffffffe0;
  QRegionPrivate *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_48,0xaa,0x40);
  QRegionPrivate::QRegionPrivate(in_RDX);
  memset(&stack0xffffffffffffff78,0xaa,0x40);
  QRegionPrivate::QRegionPrivate(in_RDX);
  bVar2 = QRegionPrivate::contains(in_RDX,in_stack_ffffffffffffff58);
  if (!bVar2) {
    SubtractRegion(in_RDX,in_stack_ffffffffffffff58,(QRegionPrivate *)0x65731a);
  }
  bVar2 = QRegionPrivate::contains(in_RDX,in_stack_ffffffffffffff58);
  if (!bVar2) {
    SubtractRegion(in_RDX,in_stack_ffffffffffffff58,(QRegionPrivate *)0x657341);
  }
  bVar2 = isEmptyHelper((QRegionPrivate *)local_48);
  if (bVar2) {
    QRegionPrivate::operator=(in_RDX,in_stack_ffffffffffffff58);
  }
  else {
    bVar2 = isEmptyHelper((QRegionPrivate *)&stack0xffffffffffffff78);
    if (bVar2) {
      QRegionPrivate::operator=(in_RDX,in_stack_ffffffffffffff58);
    }
    else {
      bVar2 = QRegionPrivate::canAppend(in_RDI,in_RSI);
      if (bVar2) {
        QRegionPrivate::operator=(in_RDX,in_stack_ffffffffffffff58);
        QRegionPrivate::append(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
      }
      else {
        bVar2 = QRegionPrivate::canAppend(in_RDI,in_RSI);
        if (bVar2) {
          QRegionPrivate::operator=(in_RDX,in_stack_ffffffffffffff58);
          QRegionPrivate::append(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
        }
        else {
          UnionRegion(in_stack_ffffffffffffff78,in_RDI,in_RSI);
        }
      }
    }
  }
  QRegionPrivate::~QRegionPrivate((QRegionPrivate *)0x657417);
  QRegionPrivate::~QRegionPrivate((QRegionPrivate *)0x657421);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void XorRegion(QRegionPrivate *sra, QRegionPrivate *srb, QRegionPrivate &dest)
{
    Q_ASSERT(!isEmptyHelper(sra) && !isEmptyHelper(srb));
    Q_ASSERT(EXTENTCHECK(&sra->extents, &srb->extents));
    Q_ASSERT(!EqualRegion(sra, srb));

    QRegionPrivate tra, trb;

    if (!srb->contains(*sra))
        SubtractRegion(sra, srb, tra);
    if (!sra->contains(*srb))
        SubtractRegion(srb, sra, trb);

    Q_ASSERT(isEmptyHelper(&trb) || !tra.contains(trb));
    Q_ASSERT(isEmptyHelper(&tra) || !trb.contains(tra));

    if (isEmptyHelper(&tra)) {
        dest = trb;
    } else if (isEmptyHelper(&trb)) {
        dest = tra;
    } else if (tra.canAppend(&trb)) {
        dest = tra;
        dest.append(&trb);
    } else if (trb.canAppend(&tra)) {
        dest = trb;
        dest.append(&tra);
    } else {
        UnionRegion(&tra, &trb, dest);
    }
}